

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpMessage.h
# Opt level: O2

void __thiscall FIX::HttpMessage::HttpMessage(HttpMessage *this,HttpMessage *copy)

{
  _Rb_tree_header *p_Var1;
  
  (this->m_root)._M_dataplus._M_p = (pointer)&(this->m_root).field_2;
  (this->m_root)._M_string_length = 0;
  (this->m_root).field_2._M_local_buf[0] = '\0';
  p_Var1 = &(this->m_parameters)._M_t._M_impl.super__Rb_tree_header;
  (this->m_parameters)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_parameters)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_parameters)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_parameters)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_parameters)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  std::__cxx11::string::_M_assign((string *)this);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::operator=(&(this->m_parameters)._M_t,&(copy->m_parameters)._M_t);
  return;
}

Assistant:

HttpMessage(const HttpMessage &copy) {
    m_root = copy.m_root;
    m_parameters = copy.m_parameters;
  }